

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O0

int TVMArrayCopyFromTo(TVMArrayHandle from,TVMArrayHandle to,TVMStreamHandle stream)

{
  runtime_error *_except_;
  TVMStreamHandle stream_local;
  TVMArrayHandle to_local;
  TVMArrayHandle from_local;
  
  tvm::runtime::NDArray::CopyFromTo(from,to,stream);
  return 0;
}

Assistant:

int TVMArrayCopyFromTo(TVMArrayHandle from,
                       TVMArrayHandle to,
                       TVMStreamHandle stream) {
  API_BEGIN();
  NDArray::CopyFromTo(from, to, stream);
  API_END();
}